

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

void funcargs(LexState *ls,expdesc *f,int line)

{
  FuncState *fs;
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  expdesc args;
  expdesc local_68;
  
  fs = ls->fs;
  local_68.usertype = (TString *)0x0;
  local_68._0_8_ = 0;
  local_68.u.ival = 0;
  local_68.u.ind.usertype = (TString *)0x0;
  local_68.t = 0;
  local_68.f = 0;
  local_68._36_4_ = 0;
  uVar1 = local_68._36_4_;
  local_68.ravi_type_map = 0xffffffff;
  local_68._36_4_ = 0;
  local_68._52_4_ = 0;
  uVar2 = local_68._52_4_;
  local_68.pc = -1;
  local_68._52_4_ = 0;
  iVar3 = (ls->t).token;
  if (iVar3 == 0x126) {
    iVar3 = luaK_stringK(fs,(ls->t).seminfo.ts);
    local_68.t = -1;
    local_68.f = -1;
    local_68.k = 4;
    local_68.u.info = iVar3;
    local_68.ravi_type_map = 0x100;
    local_68.usertype = (TString *)0x0;
    local_68.pc = -1;
    local_68.u.ind.usertype = (TString *)0x0;
    luaX_next(ls);
  }
  else if (iVar3 == 0x7b) {
    constructor(ls,&local_68);
  }
  else {
    if (iVar3 != 0x28) {
      local_68._36_4_ = uVar1;
      local_68._52_4_ = uVar2;
      luaX_syntaxerror(ls,"function arguments expected");
    }
    luaX_next(ls);
    if ((ls->t).token == 0x29) {
      local_68._0_8_ = local_68._0_8_ & 0xffffffff00000000;
    }
    else {
      explist(ls,&local_68);
      luaK_setreturns(fs,&local_68,-1);
    }
    check_match(ls,0x29,0x28,line);
  }
  if (f->k == VNONRELOC) {
    iVar3 = (f->u).info;
    iVar4 = 0;
    if (1 < local_68.k - VCALL) {
      if (local_68.k != VVOID) {
        luaK_exp2nextreg(fs,&local_68);
      }
      iVar4 = (uint)fs->freereg - iVar3;
    }
    iVar4 = luaK_codeABC(fs,OP_CALL,iVar3,iVar4,2);
    f->t = -1;
    f->f = -1;
    f->k = VCALL;
    (f->u).info = iVar4;
    f->ravi_type_map = 0xffffffff;
    f->usertype = (TString *)0x0;
    f->pc = -1;
    (f->u).ind.usertype = (TString *)0x0;
    luaK_fixline(fs,line);
    fs->freereg = (char)iVar3 + '\x01';
    return;
  }
  __assert_fail("f->k == VNONRELOC",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                ,0x616,"void funcargs(LexState *, expdesc *, int)");
}

Assistant:

static void funcargs (LexState *ls, expdesc *f, int line) {
  FuncState *fs = ls->fs;
  expdesc args = {.ravi_type_map = RAVI_TM_ANY, .pc = -1};
  int base, nparams;
  switch (ls->t.token) {
    case '(': {  /* funcargs -> '(' [ explist ] ')' */
      luaX_next(ls);
      if (ls->t.token == ')')  /* arg list is empty? */
        args.k = VVOID;
      else {
        explist(ls, &args);
        luaK_setmultret(fs, &args);
      }
      check_match(ls, ')', '(', line);
      break;
    }
    case '{': {  /* funcargs -> constructor */
      constructor(ls, &args);
      break;
    }
    case TK_STRING: {  /* funcargs -> STRING */
      codestring(ls, &args, ls->t.seminfo.ts);
      luaX_next(ls);  /* must use 'seminfo' before 'next' */
      break;
    }
    default: {
      luaX_syntaxerror(ls, "function arguments expected");
    }
  }
  lua_assert(f->k == VNONRELOC);
  base = f->u.info;  /* base register for call */
  if (hasmultret(args.k))
    nparams = LUA_MULTRET;  /* open call */
  else {
    if (args.k != VVOID)
      luaK_exp2nextreg(fs, &args);  /* close last argument */
    nparams = fs->freereg - (base+1);
  }
  init_exp(f, VCALL, luaK_codeABC(fs, OP_CALL, base, nparams + 1, 2), RAVI_TM_ANY, NULL); /* RAVI TODO return value from function call not known */
  luaK_fixline(fs, line);
  fs->freereg = base+1;  /* call remove function and arguments and leaves
                            (unless changed) one result */
}